

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primecandidate.c
# Opt level: O0

mp_int * pcs_generate(PrimeCandidateSource *s)

{
  uint32_t m;
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  mp_int *x_00;
  mp_int *r;
  mp_int *toret;
  int64_t avoid_res;
  int64_t mod;
  size_t i;
  _Bool ok;
  int64_t last_mod;
  int64_t x_res;
  mp_int *x;
  PrimeCandidateSource *s_local;
  
  if ((s->ready & 1U) == 0) {
    __assert_fail("s->ready",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/primecandidate.c"
                  ,0x172,"mp_int *pcs_generate(PrimeCandidateSource *)");
  }
  if ((s->one_shot & 1U) != 0) {
    if ((s->thrown_away_my_shot & 1U) != 0) {
      return (mp_int *)0x0;
    }
    s->thrown_away_my_shot = true;
  }
  do {
    x_00 = mp_random_upto_fn(s->limit,random_read);
    last_mod = 0;
    uVar3 = 0;
    bVar2 = true;
    for (mod = 0; (ulong)mod < s->navoids; mod = mod + 1) {
      m = s->avoids[mod].mod;
      uVar1 = s->avoids[mod].res;
      if (m != uVar3) {
        uVar3 = mp_mod_known_integer(x_00,m);
        last_mod = (int64_t)uVar3;
        uVar3 = m;
      }
      if (last_mod == (ulong)uVar1) {
        bVar2 = false;
        break;
      }
    }
    if (bVar2) {
      r = mp_new((ulong)s->bits);
      mp_mul_into(r,x_00,s->factor);
      mp_add_into(r,r,s->addend);
      mp_free(x_00);
      return r;
    }
    mp_free(x_00);
    if ((s->one_shot & 1U) != 0) {
      return (mp_int *)0x0;
    }
  } while( true );
}

Assistant:

mp_int *pcs_generate(PrimeCandidateSource *s)
{
    assert(s->ready);
    if (s->one_shot) {
        if (s->thrown_away_my_shot)
            return NULL;
        s->thrown_away_my_shot = true;
    }

    while (true) {
        mp_int *x = mp_random_upto(s->limit);

        int64_t x_res = 0, last_mod = 0;
        bool ok = true;

        for (size_t i = 0; i < s->navoids; i++) {
            int64_t mod = s->avoids[i].mod, avoid_res = s->avoids[i].res;

            if (mod != last_mod) {
                last_mod = mod;
                x_res = mp_mod_known_integer(x, mod);
            }

            if (x_res == avoid_res) {
                ok = false;
                break;
            }
        }

        if (!ok) {
            mp_free(x);
            if (s->one_shot)
                return NULL;
            continue; /* try a new x */
        }

        /*
         * We've found a viable x. Make the final output value.
         */
        mp_int *toret = mp_new(s->bits);
        mp_mul_into(toret, x, s->factor);
        mp_add_into(toret, toret, s->addend);
        mp_free(x);
        return toret;
    }
}